

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O0

void __thiscall tf::TFProfObserver::Summary::dump_tsum(Summary *this,ostream *os)

{
  anon_class_16_2_f9735b72 __f;
  ulong uVar1;
  _Setw _Var2;
  ostream *poVar3;
  size_type sVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  char *pcVar7;
  ostream *in_RSI;
  size_t i;
  size_t max_w;
  size_t min_w;
  size_t avg_w;
  size_t time_w;
  size_t count_w;
  size_t type_w;
  undefined4 in_stack_fffffffffffffe08;
  float in_stack_fffffffffffffe0c;
  TaskSummary *in_stack_fffffffffffffe10;
  anon_class_8_1_bc718827 in_stack_fffffffffffffe18;
  string local_f0 [32];
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  ulong local_c0;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  size_t *local_a0;
  undefined8 *local_98;
  size_t *local_90;
  undefined8 *local_88;
  anon_class_16_2_f9735b72 local_80;
  undefined8 *local_70;
  undefined8 *local_68;
  size_t *local_60;
  undefined8 *local_58;
  size_t *local_50;
  undefined8 *local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  ostream *local_10;
  
  local_18 = 10;
  local_20 = 5;
  local_28 = 9;
  local_30 = 8;
  local_38 = 8;
  local_40 = 8;
  local_10 = in_RSI;
  std::array<tf::TFProfObserver::TaskSummary,_7UL>::begin
            ((array<tf::TFProfObserver::TaskSummary,_7UL> *)0x1232a4);
  std::array<tf::TFProfObserver::TaskSummary,_7UL>::end
            ((array<tf::TFProfObserver::TaskSummary,_7UL> *)0x1232b9);
  local_48 = &local_20;
  local_50 = (size_t *)
             std::
             for_each<tf::TFProfObserver::TaskSummary_const*,tf::TFProfObserver::Summary::dump_tsum(std::ostream&)const::_lambda(auto:1_const&)_1_>
                       (in_stack_fffffffffffffe10,
                        (TaskSummary *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)
                        ,in_stack_fffffffffffffe18);
  std::array<tf::TFProfObserver::TaskSummary,_7UL>::begin
            ((array<tf::TFProfObserver::TaskSummary,_7UL> *)0x1232f6);
  std::array<tf::TFProfObserver::TaskSummary,_7UL>::end
            ((array<tf::TFProfObserver::TaskSummary,_7UL> *)0x12330b);
  local_58 = &local_28;
  local_60 = (size_t *)
             std::
             for_each<tf::TFProfObserver::TaskSummary_const*,tf::TFProfObserver::Summary::dump_tsum(std::ostream&)const::_lambda(auto:1_const&)_2_>
                       (in_stack_fffffffffffffe10,
                        (TaskSummary *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)
                        ,in_stack_fffffffffffffe18.count_w);
  std::array<tf::TFProfObserver::TaskSummary,_7UL>::begin
            ((array<tf::TFProfObserver::TaskSummary,_7UL> *)0x123348);
  std::array<tf::TFProfObserver::TaskSummary,_7UL>::end
            ((array<tf::TFProfObserver::TaskSummary,_7UL> *)0x12335d);
  local_70 = &local_30;
  local_68 = &local_28;
  __f.time_w = in_stack_fffffffffffffe18.count_w;
  __f.avg_w = &in_stack_fffffffffffffe10->count;
  local_80 = std::
             for_each<tf::TFProfObserver::TaskSummary_const*,tf::TFProfObserver::Summary::dump_tsum(std::ostream&)const::_lambda(auto:1_const&)_3_>
                       ((TaskSummary *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)
                        ,(TaskSummary *)0x12339d,__f);
  std::array<tf::TFProfObserver::TaskSummary,_7UL>::begin
            ((array<tf::TFProfObserver::TaskSummary,_7UL> *)0x1233ba);
  std::array<tf::TFProfObserver::TaskSummary,_7UL>::end
            ((array<tf::TFProfObserver::TaskSummary,_7UL> *)0x1233cf);
  local_88 = &local_38;
  local_90 = (size_t *)
             std::
             for_each<tf::TFProfObserver::TaskSummary_const*,tf::TFProfObserver::Summary::dump_tsum(std::ostream&)const::_lambda(auto:1_const&)_4_>
                       (in_stack_fffffffffffffe10,
                        (TaskSummary *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)
                        ,in_stack_fffffffffffffe18.count_w);
  std::array<tf::TFProfObserver::TaskSummary,_7UL>::begin
            ((array<tf::TFProfObserver::TaskSummary,_7UL> *)0x12340c);
  std::array<tf::TFProfObserver::TaskSummary,_7UL>::end
            ((array<tf::TFProfObserver::TaskSummary,_7UL> *)0x123421);
  local_98 = &local_40;
  local_a0 = (size_t *)
             std::
             for_each<tf::TFProfObserver::TaskSummary_const*,tf::TFProfObserver::Summary::dump_tsum(std::ostream&)const::_lambda(auto:1_const&)_5_>
                       (in_stack_fffffffffffffe10,
                        (TaskSummary *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)
                        ,in_stack_fffffffffffffe18.count_w);
  poVar3 = local_10;
  local_a4 = (int)std::setw((int)local_18);
  poVar3 = std::operator<<(poVar3,(_Setw)local_a4);
  poVar3 = std::operator<<(poVar3,"-Task-");
  local_a8 = (int)std::setw((int)local_20 + 2);
  poVar3 = std::operator<<(poVar3,(_Setw)local_a8);
  poVar3 = std::operator<<(poVar3,"Count");
  local_ac = (int)std::setw((int)local_28 + 2);
  poVar3 = std::operator<<(poVar3,(_Setw)local_ac);
  poVar3 = std::operator<<(poVar3,"Time (us)");
  local_b0 = (int)std::setw((int)local_30 + 2);
  poVar3 = std::operator<<(poVar3,(_Setw)local_b0);
  poVar3 = std::operator<<(poVar3,"Avg (us)");
  local_b4 = (int)std::setw((int)local_38 + 2);
  poVar3 = std::operator<<(poVar3,(_Setw)local_b4);
  poVar3 = std::operator<<(poVar3,"Min (us)");
  local_b8 = (int)std::setw((int)local_40 + 2);
  poVar3 = std::operator<<(poVar3,(_Setw)local_b8);
  poVar3 = std::operator<<(poVar3,"Max (us)");
  std::operator<<(poVar3,'\n');
  for (local_c0 = 0; uVar1 = local_c0,
      sVar4 = std::array<tf::TaskType,_7UL>::size((array<tf::TaskType,_7UL> *)TASK_TYPES),
      uVar1 < sVar4; local_c0 = local_c0 + 1) {
    pvVar5 = std::array<tf::TFProfObserver::TaskSummary,_7UL>::operator[]
                       ((array<tf::TFProfObserver::TaskSummary,_7UL> *)in_stack_fffffffffffffe10,
                        CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    poVar3 = local_10;
    if (pvVar5->count != 0) {
      local_c4 = (int)std::setw((int)local_18);
      poVar3 = std::operator<<(poVar3,(_Setw)local_c4);
      pvVar6 = std::array<tf::TaskType,_7UL>::operator[]
                         ((array<tf::TaskType,_7UL> *)in_stack_fffffffffffffe10,
                          CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      pcVar7 = to_string(*pvVar6);
      poVar3 = std::operator<<(poVar3,pcVar7);
      local_c8 = (int)std::setw((int)local_20 + 2);
      poVar3 = std::operator<<(poVar3,(_Setw)local_c8);
      pvVar5 = std::array<tf::TFProfObserver::TaskSummary,_7UL>::operator[]
                         ((array<tf::TFProfObserver::TaskSummary,_7UL> *)in_stack_fffffffffffffe10,
                          CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar5->count);
      local_cc = (int)std::setw((int)local_28 + 2);
      poVar3 = std::operator<<(poVar3,(_Setw)local_cc);
      pvVar5 = std::array<tf::TFProfObserver::TaskSummary,_7UL>::operator[]
                         ((array<tf::TFProfObserver::TaskSummary,_7UL> *)in_stack_fffffffffffffe10,
                          CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar5->total_span);
      local_d0 = (int)std::setw((int)local_30 + 2);
      poVar3 = std::operator<<(poVar3,(_Setw)local_d0);
      pvVar5 = std::array<tf::TFProfObserver::TaskSummary,_7UL>::operator[]
                         ((array<tf::TFProfObserver::TaskSummary,_7UL> *)in_stack_fffffffffffffe10,
                          CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      TaskSummary::avg_span(pvVar5);
      std::__cxx11::to_string(in_stack_fffffffffffffe0c);
      poVar3 = std::operator<<(poVar3,local_f0);
      _Var2 = std::setw((int)local_38 + 2);
      poVar3 = std::operator<<(poVar3,_Var2);
      pvVar5 = std::array<tf::TFProfObserver::TaskSummary,_7UL>::operator[]
                         ((array<tf::TFProfObserver::TaskSummary,_7UL> *)in_stack_fffffffffffffe10,
                          CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar5->min_span);
      _Var2 = std::setw((int)local_40 + 2);
      poVar3 = std::operator<<(poVar3,_Var2);
      pvVar5 = std::array<tf::TFProfObserver::TaskSummary,_7UL>::operator[]
                         ((array<tf::TFProfObserver::TaskSummary,_7UL> *)in_stack_fffffffffffffe10,
                          CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      in_stack_fffffffffffffe10 = (TaskSummary *)std::ostream::operator<<(poVar3,pvVar5->max_span);
      std::operator<<((ostream *)in_stack_fffffffffffffe10,'\n');
      std::__cxx11::string::~string(local_f0);
    }
  }
  return;
}

Assistant:

inline void TFProfObserver::Summary::dump_tsum(std::ostream& os) const {

  // task summary
  size_t type_w{10}, count_w{5}, time_w{9}, avg_w{8}, min_w{8}, max_w{8};

  std::for_each(tsum.begin(), tsum.end(), [&](const auto& i){
    if(i.count == 0) return;
	count_w = (std::max)(count_w, std::to_string(i.count).size());
  });
  
  std::for_each(tsum.begin(), tsum.end(), [&](const auto& i){
    if(i.count == 0) return;
    time_w = (std::max)(time_w, std::to_string(i.total_span).size());
  });
  
  std::for_each(tsum.begin(), tsum.end(), [&](const auto& i){
    if(i.count == 0) return;
    avg_w = (std::max)(time_w, std::to_string(i.avg_span()).size());
  });
  
  std::for_each(tsum.begin(), tsum.end(), [&](const auto& i){
    if(i.count == 0) return;
    min_w = (std::max)(min_w, std::to_string(i.min_span).size());
  });
  
  std::for_each(tsum.begin(), tsum.end(), [&](const auto& i){
    if(i.count == 0) return;
    max_w = (std::max)(max_w, std::to_string(i.max_span).size());
  });

  os << std::setw(type_w) << "-Task-" 
     << std::setw(count_w+2) << "Count"
     << std::setw(time_w+2) << "Time (us)"
     << std::setw(avg_w+2) << "Avg (us)"
     << std::setw(min_w+2) << "Min (us)"
     << std::setw(max_w+2) << "Max (us)"
     << '\n';

  for(size_t i=0; i<TASK_TYPES.size(); i++) {
    if(tsum[i].count == 0) {
      continue;
    }
    os << std::setw(type_w) << to_string(TASK_TYPES[i])
       << std::setw(count_w+2) << tsum[i].count
       << std::setw(time_w+2) << tsum[i].total_span
       << std::setw(avg_w+2) << std::to_string(tsum[i].avg_span())
       << std::setw(min_w+2) << tsum[i].min_span
       << std::setw(max_w+2) << tsum[i].max_span
       << '\n';
  }
}